

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

void cs_impl::list_cs_ext::push_back(list *lst,var *val)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  any local_20;
  any local_18;
  
  local_20.mDat = val->mDat;
  if (local_20.mDat != (proxy *)0x0) {
    (local_20.mDat)->refcount = (local_20.mDat)->refcount + 1;
  }
  cs::copy((EVP_PKEY_CTX *)&local_18,(EVP_PKEY_CTX *)&local_20);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)0x0;
  p_Var2[1]._M_next = (_List_node_base *)local_18.mDat;
  local_18.mDat = (proxy *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  any::recycle(&local_18);
  any::recycle(&local_20);
  return;
}

Assistant:

void push_back(list &lst, const var &val)
		{
			lst.push_back(copy(val));
		}